

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O0

Translator * __thiscall
helics::ConnectorFederateManager::getTranslator(ConnectorFederateManager *this,string_view name)

{
  string_view searchValue;
  bool bVar1;
  char *in_RDX;
  size_t in_RSI;
  BlockIterator<helics::Translator,_32,_helics::Translator_**> tran;
  handle trans;
  BlockIterator<const_helics::Translator,_32,_const_helics::Translator_*const_*>
  *in_stack_ffffffffffffff58;
  BlockIterator<helics::Translator,_32,_helics::Translator_**> *in_stack_ffffffffffffff60;
  undefined1 *puVar2;
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_ffffffffffffff98;
  StringMappedVector<helics::Translator,_(reference_stability)0,_5> *in_stack_ffffffffffffffa0;
  BlockIterator<helics::Translator,_32,_helics::Translator_**> local_48;
  lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  local_30;
  size_t local_10;
  char *pcStack_8;
  
  local_10 = in_RSI;
  pcStack_8 = in_RDX;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(in_stack_ffffffffffffff98);
  gmlc::libguarded::
  lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::operator->(&local_30);
  searchValue._M_str = pcStack_8;
  searchValue._M_len = local_10;
  gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>::find
            (in_stack_ffffffffffffffa0,searchValue);
  gmlc::libguarded::
  lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::end((lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
         *)in_stack_ffffffffffffff60);
  bVar1 = gmlc::containers::BlockIterator<helics::Translator,32,helics::Translator**>::operator!=
                    (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (bVar1) {
    puVar2 = (undefined1 *)
             gmlc::containers::BlockIterator<helics::Translator,_32,_helics::Translator_**>::
             operator*(&local_48);
  }
  else {
    puVar2 = invalidTranNC;
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
                  *)0x31305b);
  return (Translator *)puVar2;
}

Assistant:

Translator& ConnectorFederateManager::getTranslator(std::string_view name)
{
    auto trans = translators.lock();
    auto tran = trans->find(name);
    return (tran != trans.end()) ? (*tran) : invalidTranNC;
}